

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FluctuatingChargeConstraints.cpp
# Opt level: O1

void __thiscall
OpenMD::FluctuatingChargeConstraints::setConstrainRegions
          (FluctuatingChargeConstraints *this,bool cr)

{
  _Rb_tree_header *p_Var1;
  pointer pdVar2;
  _Base_ptr p_Var3;
  int iVar4;
  pointer piVar5;
  vector<int,_std::allocator<int>_> localRegions;
  set<int,_std::less<int>,_std::allocator<int>_> regions;
  vector<int,_std::allocator<int>_> local_70;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_58;
  
  this->constrainRegions_ = cr;
  if (this->initialized_ == false) {
    if ((this->info_->usesFluctuatingCharges_ == true) &&
       (0 < this->info_->nGlobalFluctuatingCharges_)) {
      this->hasFlucQ_ = true;
    }
    this->initialized_ = true;
  }
  piVar5 = (this->regionKeys_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->regionKeys_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar5) {
    (this->regionKeys_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar5;
  }
  pdVar2 = (this->regionForce_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->regionForce_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->regionForce_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  pdVar2 = (this->regionCMom_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->regionCMom_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->regionCMom_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  piVar5 = (this->regionCharges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->regionCharges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar5) {
    (this->regionCharges_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar5;
  }
  if (cr) {
    std::vector<int,_std::allocator<int>_>::vector(&local_70,&this->info_->regions_);
    p_Var1 = &local_58._M_impl.super__Rb_tree_header;
    local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_58._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_58._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      piVar5 = local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        if (-1 < *piVar5) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_58,piVar5);
        }
        piVar5 = piVar5 + 1;
      } while (piVar5 != local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    std::vector<int,_std::allocator<int>_>::resize
              (&this->regionKeys_,(long)(int)local_58._M_impl.super__Rb_tree_header._M_node_count);
    if ((_Rb_tree_header *)local_58._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      piVar5 = (this->regionKeys_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar4 = 0;
      p_Var3 = local_58._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        piVar5[(int)p_Var3[1]._M_color] = iVar4;
        iVar4 = iVar4 + 1;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var1);
    }
    std::vector<double,_std::allocator<double>_>::resize
              (&this->regionForce_,
               (long)(this->regionKeys_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->regionKeys_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
    std::vector<double,_std::allocator<double>_>::resize
              (&this->regionCMom_,
               (long)(this->regionKeys_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->regionKeys_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
    std::vector<int,_std::allocator<int>_>::resize
              (&this->regionCharges_,
               (long)(this->regionKeys_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->regionKeys_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
    std::vector<double,_std::allocator<double>_>::resize
              (&this->regionChargeMass_,
               (long)(this->regionKeys_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->regionKeys_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&local_58);
    if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void FluctuatingChargeConstraints::setConstrainRegions(bool cr) {
    constrainRegions_ = cr;

    if (!initialized_) initialize();

    regionKeys_.clear();
    regionForce_.clear();
    regionCMom_.clear();
    regionCharges_.clear();

    if (constrainRegions_) {
      std::vector<int> localRegions = info_->getRegions();

#ifdef IS_MPI
      int size;
      MPI_Comm_size(MPI_COMM_WORLD, &size);
      int mylen = localRegions.size();

      std::vector<int> counts;
      std::vector<int> displs;

      counts.resize(size, 0);
      displs.resize(size, 0);

      MPI_Allgather(&mylen, 1, MPI_INT, &counts[0], 1, MPI_INT, MPI_COMM_WORLD);

      int total = counts[0];

      for (int i = 1; i < size; i++) {
        total += counts[i];
        displs[i] = displs[i - 1] + counts[i - 1];
      }

      std::vector<int> globalRegions(total, 0);

      MPI_Allgatherv(&localRegions[0], mylen, MPI_INT, &globalRegions[0],
                     &counts[0], &displs[0], MPI_INT, MPI_COMM_WORLD);

      localRegions = globalRegions;
#endif

      std::set<int> regions;
      std::vector<int>::iterator iter;
      for (iter = localRegions.begin(); iter != localRegions.end(); ++iter) {
        if (*iter >= 0) regions.insert(*iter);
      }

      // resize the keys vector to the largest found value for regions.
      regionKeys_.resize(*(regions.end()));
      int which = 0;
      for (std::set<int>::iterator r = regions.begin(); r != regions.end();
           ++r) {
        regionKeys_[(*r)] = which;
        which++;
      }
      regionForce_.resize(regionKeys_.size());
      regionCMom_.resize(regionKeys_.size());
      regionCharges_.resize(regionKeys_.size());
      regionChargeMass_.resize(regionKeys_.size());
    }
  }